

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void make_niches(level *lev)

{
  schar sVar1;
  uint uVar2;
  bool bVar3;
  int trap_type;
  int iVar4;
  bool bVar5;
  
  iVar4 = lev->nroom;
  uVar2 = mt_random();
  sVar1 = depth(&lev->z);
  bVar3 = '\x0f' < sVar1 && ((lev->flags).field_0x9 & 8) == 0;
  bVar5 = (byte)(sVar1 - 6U) < 0x13;
  iVar4 = SUB164(ZEXT416(uVar2) % SEXT816((long)((iVar4 >> 1) + 1)),0) + 1;
  do {
    if (bVar3) {
      uVar2 = mt_random();
      if (0x2aaaaaaa < (uVar2 * -0x55555555 >> 1 | (uint)((uVar2 * -0x55555555 & 1) != 0) << 0x1f))
      goto LAB_001d9d5d;
      trap_type = 0x11;
      bVar3 = false;
    }
    else {
LAB_001d9d5d:
      if (bVar5) {
        uVar2 = mt_random();
        if ((uVar2 * -0x55555555 >> 1 | (uint)((uVar2 * -0x55555555 & 1) != 0) << 0x1f) < 0x2aaaaaab
           ) {
          trap_type = 0xe;
          bVar5 = false;
          goto LAB_001d9d78;
        }
      }
      trap_type = 0;
    }
LAB_001d9d78:
    makeniche(lev,trap_type);
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void make_niches(struct level *lev)
{
	int ct = rnd((lev->nroom>>1) + 1), dep = depth(&lev->z);

	boolean	ltptr = (!lev->flags.noteleport && dep > 15),
		vamp = (dep > 5 && dep < 25);

	while (ct--) {
		if (ltptr && !rn2(6)) {
			ltptr = FALSE;
			makeniche(lev, LEVEL_TELEP);
		} else if (vamp && !rn2(6)) {
			vamp = FALSE;
			makeniche(lev, TRAPDOOR);
		} else	makeniche(lev, NO_TRAP);
	}
}